

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
libcellml::Validator::ValidatorImpl::validateVariableInterface
          (ValidatorImpl *this,VariablePtr *variable,VariableMap *alreadyReported)

{
  IssueImpl *pIVar1;
  bool bVar2;
  const_iterator cVar3;
  size_t sVar4;
  ulong uVar5;
  __normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
  _Var6;
  string *this_00;
  __normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
  __it;
  long lVar7;
  long lVar8;
  InterfaceType interfaceType;
  __shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *local_2c8;
  IssueImpl *local_2c0;
  VariableMap *local_2b8;
  VariablePtr equivalentVariable;
  IssuePtr err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string interfaceTypeString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ValidatorImpl *local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  IssuePtr err;
  ComponentPtr equivalentComponent;
  string local_150;
  ComponentPtr component;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string componentName;
  VariablePairPtr pair;
  anon_class_32_2_f86da958_for__M_pred local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_2b8 = alreadyReported;
  local_230 = this;
  interfaceType = determineInterfaceType(variable);
  std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Variable,void>
            ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)
             &interfaceTypeString,
             &variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
  owningComponent((ParentedEntityConstPtr *)&component);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&interfaceTypeString._M_string_length);
  NamedEntity::name_abi_cxx11_
            (&componentName,
             (NamedEntity *)
             component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (interfaceType == NONE) {
    uVar5 = 0;
    local_2c8 = &variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>;
    while( true ) {
      sVar4 = Variable::equivalentVariableCount
                        ((variable->
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                        );
      if (sVar4 <= uVar5) break;
      Variable::equivalentVariable
                ((Variable *)&equivalentVariable,
                 (size_t)(variable->
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                );
      std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libcellml::Variable,void>
                ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)
                 &interfaceTypeString,
                 (__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)
                 &equivalentVariable);
      owningComponent((ParentedEntityConstPtr *)&equivalentComponent);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&interfaceTypeString._M_string_length
                );
      if ((equivalentComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != (element_type *)0x0) &&
         (bVar2 = reachableEquivalence(variable,&equivalentVariable), !bVar2)) {
        __it._M_current =
             (local_2b8->
             super__Vector_base<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (IssueImpl *)
                 (local_2b8->
                 super__Vector_base<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)&local_d0,
                   &equivalentVariable.
                    super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
        std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_d0.variable.
                    super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>,
                   &variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
        validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)
        ::$_0::__0((__0 *)&local_290,&local_d0);
        validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)
        ::$_0::__0((__0 *)&interfaceTypeString,(anon_class_32_2_f86da958_for__M_pred *)&local_290);
        validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)
        ::$_0::__0((__0 *)&local_250,(anon_class_32_2_f86da958_for__M_pred *)&interfaceTypeString);
        validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)
        ::$_0::~__0((__0 *)&interfaceTypeString);
        validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)
        ::$_0::__0((__0 *)&interfaceTypeString,(anon_class_32_2_f86da958_for__M_pred *)&local_250);
        lVar7 = (long)pIVar1 - (long)__it._M_current;
        local_2c0 = pIVar1;
        for (lVar8 = lVar7 >> 6; _Var6._M_current = __it._M_current, 0 < lVar8; lVar8 = lVar8 + -1)
        {
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                  ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                *)&interfaceTypeString,__it);
          variable = (VariablePtr *)local_2c8;
          if (bVar2) goto LAB_00224bc7;
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                  ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                *)&interfaceTypeString,__it._M_current + 1);
          _Var6._M_current = __it._M_current + 1;
          variable = (VariablePtr *)local_2c8;
          if (bVar2) goto LAB_00224bc7;
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                  ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                *)&interfaceTypeString,__it._M_current + 2);
          _Var6._M_current = __it._M_current + 2;
          variable = (VariablePtr *)local_2c8;
          if (bVar2) goto LAB_00224bc7;
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                  ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                *)&interfaceTypeString,__it._M_current + 3);
          _Var6._M_current = __it._M_current + 3;
          variable = (VariablePtr *)local_2c8;
          if (bVar2) goto LAB_00224bc7;
          __it._M_current = __it._M_current + 4;
          lVar7 = lVar7 + -0x40;
        }
        lVar7 = lVar7 >> 4;
        variable = (VariablePtr *)local_2c8;
        if (lVar7 == 1) {
LAB_00224ee4:
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                  ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                *)&interfaceTypeString,__it);
          _Var6._M_current = (shared_ptr<libcellml::VariablePair> *)local_2c0;
          if (bVar2) {
            _Var6._M_current = __it._M_current;
          }
        }
        else if (lVar7 == 2) {
LAB_00224b9b:
          variable = (VariablePtr *)local_2c8;
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                  ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                *)&interfaceTypeString,_Var6);
          if (!bVar2) {
            __it._M_current = _Var6._M_current + 1;
            goto LAB_00224ee4;
          }
        }
        else {
          _Var6._M_current = (shared_ptr<libcellml::VariablePair> *)local_2c0;
          if ((lVar7 == 3) &&
             (bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                      ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                    *)&interfaceTypeString,__it), _Var6._M_current = __it._M_current
             , variable = (VariablePtr *)local_2c8, !bVar2)) {
            _Var6._M_current = __it._M_current + 1;
            goto LAB_00224b9b;
          }
        }
LAB_00224bc7:
        validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)
        ::$_0::~__0((__0 *)&interfaceTypeString);
        validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)
        ::$_0::~__0((__0 *)&local_250);
        validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)
        ::$_0::~__0((__0 *)&local_290);
        validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)
        ::$_0::~__0((__0 *)&local_d0);
        if ((IssueImpl *)_Var6._M_current ==
            (IssueImpl *)
            (local_2b8->
            super__Vector_base<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          VariablePair::create((VariablePair *)&pair,variable,&equivalentVariable);
          std::
          vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
          ::push_back(local_2b8,&pair);
          NamedEntity::name_abi_cxx11_
                    (&interfaceTypeString,
                     (NamedEntity *)
                     equivalentComponent.
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          Issue::IssueImpl::create();
          local_2c0 = (err_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->mPimpl;
          NamedEntity::name_abi_cxx11_
                    (&local_90,
                     &((variable->
                       super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_NamedEntity);
          std::operator+(&local_70,"The equivalence between \'",&local_90);
          std::operator+(&local_50,&local_70,"\' in component \'");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,
                         &local_50,&componentName);
          std::operator+(&local_150,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,
                         "\'  and \'");
          NamedEntity::name_abi_cxx11_
                    (&local_b0,
                     &(equivalentVariable.
                       super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_NamedEntity);
          std::operator+(&local_120,&local_150,&local_b0);
          std::operator+(&local_228,&local_120,"\' in component \'");
          std::operator+(&local_208,&local_228,&interfaceTypeString);
          std::operator+(&local_1e8,&local_208,"\' is invalid. Component \'");
          std::operator+(&local_1c8,&local_1e8,&componentName);
          std::operator+(&local_1a8,&local_1c8,"\' and \'");
          std::operator+(&local_290,&local_1a8,&interfaceTypeString);
          std::operator+(&local_250,&local_290,
                         "\' are neither siblings nor in a parent/child relationship.");
          Issue::IssueImpl::setDescription(local_2c0,&local_250);
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_290);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&err);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          AnyCellmlElement::AnyCellmlElementImpl::setMapVariables
                    ((((err_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl->mItem).
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,variable,&equivalentVariable);
          Issue::IssueImpl::setReferenceRule
                    ((err_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->mPimpl,MAP_VARIABLES_ELEMENT);
          Logger::LoggerImpl::addIssue(&local_230->super_LoggerImpl,&err_1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&err_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::~string((string *)&interfaceTypeString);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&pair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&equivalentComponent.
                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&equivalentVariable.
                  super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      uVar5 = uVar5 + 1;
    }
  }
  else {
    Variable::interfaceType_abi_cxx11_
              (&interfaceTypeString,
               (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    bVar2 = interfaceTypeIsCompatible(interfaceType,&interfaceTypeString);
    if (!bVar2) {
      Issue::IssueImpl::create();
      pIVar1 = (err.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mPimpl
      ;
      if (interfaceTypeString._M_string_length == 0) {
        NamedEntity::name_abi_cxx11_
                  (&local_228,
                   &((variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr)->super_NamedEntity);
        std::operator+(&local_208,"Variable \'",&local_228);
        std::operator+(&local_1e8,&local_208,"\' in component \'");
        std::operator+(&local_1c8,&local_1e8,&componentName);
        std::operator+(&local_1a8,&local_1c8,
                       "\' has no interface type set. The interface type required is \'");
        cVar3 = std::
                _Rb_tree<libcellml::Variable::InterfaceType,_std::pair<const_libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<libcellml::Variable::InterfaceType>,_std::allocator<std::pair<const_libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find((_Rb_tree<libcellml::Variable::InterfaceType,_std::pair<const_libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<libcellml::Variable::InterfaceType>,_std::allocator<std::pair<const_libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)libcellml::interfaceTypeToString_abi_cxx11_,&interfaceType);
        std::operator+(&local_290,&local_1a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cVar3._M_node[1]._M_parent);
        std::operator+(&local_250,&local_290,"\'.");
        Issue::IssueImpl::setDescription(pIVar1,&local_250);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_208);
        this_00 = &local_228;
      }
      else {
        NamedEntity::name_abi_cxx11_
                  (&local_150,
                   &((variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr)->super_NamedEntity);
        std::operator+(&local_120,"Variable \'",&local_150);
        std::operator+(&local_228,&local_120,"\' in component \'");
        std::operator+(&local_208,&local_228,&componentName);
        std::operator+(&local_1e8,&local_208,"\' has an interface type set to \'");
        std::operator+(&local_1c8,&local_1e8,&interfaceTypeString);
        std::operator+(&local_1a8,&local_1c8,
                       "\' which is not the correct interface type for this variable. The interface type required is \'"
                      );
        cVar3 = std::
                _Rb_tree<libcellml::Variable::InterfaceType,_std::pair<const_libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<libcellml::Variable::InterfaceType>,_std::allocator<std::pair<const_libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find((_Rb_tree<libcellml::Variable::InterfaceType,_std::pair<const_libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<libcellml::Variable::InterfaceType>,_std::allocator<std::pair<const_libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)libcellml::interfaceTypeToString_abi_cxx11_,&interfaceType);
        std::operator+(&local_290,&local_1a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cVar3._M_node[1]._M_parent);
        std::operator+(&local_250,&local_290,"\'.");
        Issue::IssueImpl::setDescription(pIVar1,&local_250);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_120);
        this_00 = &local_150;
      }
      std::__cxx11::string::~string((string *)this_00);
      AnyCellmlElement::AnyCellmlElementImpl::setVariable
                ((((err.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl->mItem).
                  super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->mPimpl,variable);
      Issue::IssueImpl::setReferenceRule
                ((err.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl,MAP_VARIABLES_ELEMENT);
      Logger::LoggerImpl::addIssue(&local_230->super_LoggerImpl,&err);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&err.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::__cxx11::string::~string((string *)&interfaceTypeString);
  }
  std::__cxx11::string::~string((string *)&componentName);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void Validator::ValidatorImpl::validateVariableInterface(const VariablePtr &variable, VariableMap &alreadyReported)
{
    Variable::InterfaceType interfaceType = determineInterfaceType(variable);
    auto component = owningComponent(variable);
    std::string componentName = component->name();
    if (interfaceType == Variable::InterfaceType::NONE) {
        for (size_t index = 0; index < variable->equivalentVariableCount(); ++index) {
            const auto equivalentVariable = variable->equivalentVariable(index);
            auto equivalentComponent = owningComponent(equivalentVariable);
            if (equivalentComponent != nullptr && !reachableEquivalence(variable, equivalentVariable)) {
                auto it = std::find_if(alreadyReported.begin(), alreadyReported.end(),
                                       [equivalentVariable, variable](const VariablePairPtr &in) {
                                           return (in->variable1() == equivalentVariable) && (in->variable2() == variable);
                                       });
                if (it == alreadyReported.end()) {
                    VariablePairPtr pair = VariablePair::create(variable, equivalentVariable);
                    alreadyReported.push_back(pair);
                    std::string equivalentComponentName = equivalentComponent->name();

                    IssuePtr err = Issue::IssueImpl::create();
                    err->mPimpl->setDescription("The equivalence between '" + variable->name() + "' in component '" + componentName + "'  and '" + equivalentVariable->name() + "' in component '" + equivalentComponentName + "' is invalid. Component '" + componentName + "' and '" + equivalentComponentName + "' are neither siblings nor in a parent/child relationship.");
                    err->mPimpl->mItem->mPimpl->setMapVariables(variable, equivalentVariable);
                    err->mPimpl->setReferenceRule(Issue::ReferenceRule::MAP_VARIABLES_ELEMENT);
                    addIssue(err);
                }
            }
        }
    } else {
        auto interfaceTypeString = variable->interfaceType();
        if (!interfaceTypeIsCompatible(interfaceType, interfaceTypeString)) {
            IssuePtr err = Issue::IssueImpl::create();
            if (interfaceTypeString.empty()) {
                err->mPimpl->setDescription("Variable '" + variable->name() + "' in component '" + componentName + "' has no interface type set. The interface type required is '" + interfaceTypeToString.find(interfaceType)->second + "'.");
            } else {
                err->mPimpl->setDescription("Variable '" + variable->name() + "' in component '" + componentName + "' has an interface type set to '" + interfaceTypeString + "' which is not the correct interface type for this variable. The interface type required is '" + interfaceTypeToString.find(interfaceType)->second + "'.");
            }
            err->mPimpl->mItem->mPimpl->setVariable(variable);
            err->mPimpl->setReferenceRule(Issue::ReferenceRule::MAP_VARIABLES_ELEMENT);
            addIssue(err);
        }
    }
}